

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ValidatorUtils-inl.hpp
# Opt level: O0

Result * CoreML::validateSchemaTypes
                   (Result *__return_storage_ptr__,
                   vector<CoreML::Specification::FeatureType::TypeCase,_std::allocator<CoreML::Specification::FeatureType::TypeCase>_>
                   *allowedFeatureTypes,FeatureDescription *featureDesc)

{
  bool bVar1;
  bool bVar2;
  TypeCase TVar3;
  MLFeatureTypeType x;
  FeatureType *pFVar4;
  ostream *poVar5;
  char *pcVar6;
  string *__lhs;
  string local_248;
  MLFeatureTypeType *local_228;
  TypeCase *t_1;
  const_iterator __end1_1;
  const_iterator __begin1_1;
  vector<CoreML::Specification::FeatureType::TypeCase,_std::allocator<CoreML::Specification::FeatureType::TypeCase>_>
  *__range1_1;
  undefined1 local_200 [7];
  bool isFirst;
  stringstream local_1d0 [8];
  stringstream out;
  ostream local_1c0 [376];
  reference local_48;
  TypeCase *t;
  const_iterator __end1;
  const_iterator __begin1;
  vector<CoreML::Specification::FeatureType::TypeCase,_std::allocator<CoreML::Specification::FeatureType::TypeCase>_>
  *__range1;
  TypeCase type;
  FeatureDescription *featureDesc_local;
  vector<CoreML::Specification::FeatureType::TypeCase,_std::allocator<CoreML::Specification::FeatureType::TypeCase>_>
  *allowedFeatureTypes_local;
  
  pFVar4 = Specification::FeatureDescription::type(featureDesc);
  TVar3 = Specification::FeatureType::Type_case(pFVar4);
  __end1 = std::
           vector<CoreML::Specification::FeatureType::TypeCase,_std::allocator<CoreML::Specification::FeatureType::TypeCase>_>
           ::begin(allowedFeatureTypes);
  t = (TypeCase *)
      std::
      vector<CoreML::Specification::FeatureType::TypeCase,_std::allocator<CoreML::Specification::FeatureType::TypeCase>_>
      ::end(allowedFeatureTypes);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<const_CoreML::Specification::FeatureType::TypeCase_*,_std::vector<CoreML::Specification::FeatureType::TypeCase,_std::allocator<CoreML::Specification::FeatureType::TypeCase>_>_>
                                *)&t);
    if (!bVar1) {
      std::__cxx11::stringstream::stringstream(local_1d0);
      poVar5 = std::operator<<(local_1c0,"Unsupported type \"");
      pFVar4 = Specification::FeatureDescription::type(featureDesc);
      x = Specification::FeatureType::Type_case(pFVar4);
      pcVar6 = ::MLFeatureTypeType_Name(x);
      poVar5 = std::operator<<(poVar5,pcVar6);
      poVar5 = std::operator<<(poVar5,"\" for feature \"");
      __lhs = Specification::FeatureDescription::name_abi_cxx11_(featureDesc);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_200,
                     __lhs,"\". Should be one of: ");
      std::operator<<(poVar5,(string *)local_200);
      std::__cxx11::string::~string((string *)local_200);
      bVar1 = true;
      __end1_1 = std::
                 vector<CoreML::Specification::FeatureType::TypeCase,_std::allocator<CoreML::Specification::FeatureType::TypeCase>_>
                 ::begin(allowedFeatureTypes);
      t_1 = (TypeCase *)
            std::
            vector<CoreML::Specification::FeatureType::TypeCase,_std::allocator<CoreML::Specification::FeatureType::TypeCase>_>
            ::end(allowedFeatureTypes);
      while (bVar2 = __gnu_cxx::operator!=
                               (&__end1_1,
                                (__normal_iterator<const_CoreML::Specification::FeatureType::TypeCase_*,_std::vector<CoreML::Specification::FeatureType::TypeCase,_std::allocator<CoreML::Specification::FeatureType::TypeCase>_>_>
                                 *)&t_1), bVar2) {
        local_228 = __gnu_cxx::
                    __normal_iterator<const_CoreML::Specification::FeatureType::TypeCase_*,_std::vector<CoreML::Specification::FeatureType::TypeCase,_std::allocator<CoreML::Specification::FeatureType::TypeCase>_>_>
                    ::operator*(&__end1_1);
        if (!bVar1) {
          std::operator<<(local_1c0,", ");
        }
        pcVar6 = ::MLFeatureTypeType_Name(*local_228);
        std::operator<<(local_1c0,pcVar6);
        bVar1 = false;
        __gnu_cxx::
        __normal_iterator<const_CoreML::Specification::FeatureType::TypeCase_*,_std::vector<CoreML::Specification::FeatureType::TypeCase,_std::allocator<CoreML::Specification::FeatureType::TypeCase>_>_>
        ::operator++(&__end1_1);
      }
      poVar5 = std::operator<<(local_1c0,".");
      std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
      std::__cxx11::stringstream::str();
      Result::Result(__return_storage_ptr__,UNSUPPORTED_FEATURE_TYPE_FOR_MODEL_TYPE,&local_248);
      std::__cxx11::string::~string((string *)&local_248);
      std::__cxx11::stringstream::~stringstream(local_1d0);
      return __return_storage_ptr__;
    }
    local_48 = __gnu_cxx::
               __normal_iterator<const_CoreML::Specification::FeatureType::TypeCase_*,_std::vector<CoreML::Specification::FeatureType::TypeCase,_std::allocator<CoreML::Specification::FeatureType::TypeCase>_>_>
               ::operator*(&__end1);
    if (TVar3 == *local_48) break;
    __gnu_cxx::
    __normal_iterator<const_CoreML::Specification::FeatureType::TypeCase_*,_std::vector<CoreML::Specification::FeatureType::TypeCase,_std::allocator<CoreML::Specification::FeatureType::TypeCase>_>_>
    ::operator++(&__end1);
  }
  Result::Result(__return_storage_ptr__);
  return __return_storage_ptr__;
}

Assistant:

inline Result validateSchemaTypes(const std::vector<Specification::FeatureType::TypeCase>& allowedFeatureTypes,
                 const Specification::FeatureDescription& featureDesc) {
        
        // Check the types
        auto type = featureDesc.type().Type_case();
        for (const auto& t : allowedFeatureTypes) {
            if (type == t) {
                // no invariant broken -- type matches one of the allowed types
                return Result();
            }
        }
        
        // Invalid type
        std::stringstream out;
        out << "Unsupported type \"" << MLFeatureTypeType_Name(static_cast<MLFeatureTypeType>(featureDesc.type().Type_case()))
        << "\" for feature \"" << featureDesc.name() + "\". Should be one of: ";
        bool isFirst = true;
        for (const auto& t: allowedFeatureTypes) {
            if (!isFirst) {
                out << ", ";
            }
            out << MLFeatureTypeType_Name(static_cast<MLFeatureTypeType>(t));
            isFirst = false;
        }
        out << "." << std::endl;
        return Result(ResultType::UNSUPPORTED_FEATURE_TYPE_FOR_MODEL_TYPE, out.str());
    }